

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

key_type * __thiscall
nlohmann::detail::
iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::key(key_type *__return_storage_ptr__,
     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
     *this)

{
  _Base_ptr p_Var1;
  long lVar2;
  invalid_iterator *__return_storage_ptr___00;
  string local_40;
  
  if (this->m_object->m_type == object) {
    p_Var1 = (this->m_it).object_iterator._M_node;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *(long *)(p_Var1 + 1);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,(long)&(p_Var1[1]._M_parent)->_M_color + lVar2
              );
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (invalid_iterator *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"cannot use key() for non-object iterators","");
  invalid_iterator::create(__return_storage_ptr___00,0xcf,&local_40);
  __cxa_throw(__return_storage_ptr___00,&invalid_iterator::typeinfo,exception::~exception);
}

Assistant:

typename object_t::key_type key() const
{
assert(m_object != nullptr);

if (JSON_LIKELY(m_object->is_object()))
{
return m_it.object_iterator->first;
}

JSON_THROW(invalid_iterator::create(207, "cannot use key() for non-object iterators"));
}